

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fshook_stdio.c
# Opt level: O3

ALLEGRO_FS_ENTRY * create_abs_path_entry(WRAP_CHAR *abs_path)

{
  _Bool _Var1;
  ALLEGRO_FS_ENTRY *fp;
  size_t sVar2;
  ALLEGRO_FS_INTERFACE *__dest;
  int *piVar3;
  
  fp = (ALLEGRO_FS_ENTRY *)
       al_calloc_with_context
                 (1,0xb0,0xee,
                  "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/fshook_stdio.c"
                  ,"create_abs_path_entry");
  if (fp == (ALLEGRO_FS_ENTRY *)0x0) {
    piVar3 = __errno_location();
    al_set_errno(*piVar3);
  }
  else {
    fp->vtable = &_al_fs_interface_stdio;
    sVar2 = strlen(abs_path);
    __dest = (ALLEGRO_FS_INTERFACE *)
             al_malloc_with_context
                       (sVar2 + 1,0xf7,
                        "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/fshook_stdio.c"
                        ,"create_abs_path_entry");
    fp[1].vtable = __dest;
    if (__dest != (ALLEGRO_FS_INTERFACE *)0x0) {
      memcpy(__dest,abs_path,sVar2 + 1);
      _Var1 = _al_trace_prefix("fshook",0,
                               "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/fshook_stdio.c"
                               ,0x107,"create_abs_path_entry");
      if (_Var1) {
        _al_trace_suffix("Creating entry for %s\n",fp[1].vtable);
      }
      fs_stdio_update_entry(fp);
      return fp;
    }
    al_free_with_context
              (fp,0xf9,
               "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/fshook_stdio.c"
               ,"create_abs_path_entry");
  }
  return (ALLEGRO_FS_ENTRY *)0x0;
}

Assistant:

static ALLEGRO_FS_ENTRY *create_abs_path_entry(const WRAP_CHAR *abs_path)
{
   ALLEGRO_FS_ENTRY_STDIO *fh;
   size_t len;

   fh = al_calloc(1, sizeof(*fh));
   if (!fh) {
      al_set_errno(errno);
      return NULL;
   }

   fh->fs_entry.vtable = &_al_fs_interface_stdio;

   len = WRAP_STRLEN(abs_path) + 1; /* including terminator */
   fh->abs_path = al_malloc(len * sizeof(WRAP_CHAR));
   if (!fh->abs_path) {
      al_free(fh);
      return NULL;
   }
   memcpy(fh->abs_path, abs_path, len * sizeof(WRAP_CHAR));

#ifdef ALLEGRO_WINDOWS
   fh->abs_path_utf8 = _al_win_utf16_to_utf8(fh->abs_path);
   if (!fh->abs_path_utf8) {
      al_free(fh->abs_path);
      al_free(fh);
      return NULL;
   }
#endif

   ALLEGRO_DEBUG("Creating entry for %s\n", fh->ABS_PATH_UTF8);

   fs_stdio_update_entry((ALLEGRO_FS_ENTRY *) fh);

   return (ALLEGRO_FS_ENTRY *) fh;
}